

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

_Bool borg_best_stuff(void)

{
  byte bVar1;
  borg_shop *pbVar2;
  _Bool _Var3;
  uint16_t uVar4;
  uint8_t *best;
  uint8_t *test;
  borg_best *p;
  borg_item_conflict *pbVar5;
  char *what;
  bool bVar6;
  ulong uVar7;
  borg_item_conflict *pbVar8;
  int16_t *piVar9;
  ulong uVar10;
  ulong uVar11;
  int32_t value;
  int32_t local_34;
  
  if (shop_num == 7) {
    if (!borg.goal.do_best) {
      _Var3 = borg_one_step_wearing_best(0);
      return _Var3;
    }
    _Var3 = borg_home_full();
    if (((!_Var3) && (_Var3 = borg_inventory_full(), !_Var3)) && (borg.goal.do_best == true)) {
      best = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
      test = (uint8_t *)mem_alloc((ulong)z_info->equip_slots_max);
      if (z_info->equip_slots_max != 0) {
        uVar7 = 0;
        do {
          test[uVar7] = 0xff;
          best[uVar7] = 0xff;
          uVar7 = uVar7 + 1;
        } while (uVar7 < z_info->equip_slots_max);
      }
      local_34 = borg.power;
      borg_best_stuff_aux(0,test,best,&local_34);
      borg_notice(true);
      p = (borg_best *)mem_zalloc((ulong)((uint)z_info->equip_slots_max * 2) * 3);
      pbVar2 = borg_shops;
      pbVar8 = borg_items;
      uVar7 = (ulong)z_info->equip_slots_max;
      borg.goal.best_item = p;
      if (uVar7 == 0) {
LAB_0022eca2:
        if (p != (borg_best *)0x0) {
          mem_free(p);
          borg.goal.best_item = (borg_best *)0x0;
        }
        borg.goal.do_best = false;
        if (*borg_cfg != 0) {
          borg_note("new best: no changes");
        }
      }
      else {
        uVar10 = 0;
        bVar6 = false;
        do {
          piVar9 = &p[uVar10].pval;
          uVar11 = uVar10;
          while( true ) {
            uVar10 = uVar11 + 1;
            bVar1 = best[uVar11];
            uVar4 = borg_best_stuff_order((int)uVar11);
            if ((bVar1 != 0xff) && (uVar4 != bVar1)) break;
            piVar9 = piVar9 + 3;
            uVar11 = uVar10;
            if (uVar10 == uVar7) {
              if (bVar6) goto LAB_0022ec15;
              goto LAB_0022eca2;
            }
          }
          if (bVar1 < 100) {
            pbVar5 = pbVar8 + bVar1;
          }
          else {
            pbVar5 = pbVar2[7].ware + ((ulong)bVar1 - 100);
            ((borg_best *)(piVar9 + -2))->home = true;
          }
          *(uint8_t *)((long)piVar9 + -3) = pbVar5->tval;
          *piVar9 = pbVar5->pval;
          *(uint8_t *)(piVar9 + -1) = pbVar5->sval;
          bVar6 = true;
        } while (uVar10 != uVar7);
LAB_0022ec15:
        borg.goal.do_best = false;
        if (*borg_cfg != 0) {
          uVar7 = 0;
          do {
            bVar1 = best[uVar7];
            if ((ulong)bVar1 < 0x65) {
              pbVar8 = borg_items + bVar1;
            }
            else {
              pbVar8 = borg_shops[7].ware + (bVar1 - 100);
            }
            what = format("new best: %s",pbVar8);
            borg_note(what);
            uVar7 = uVar7 + 1;
          } while (uVar7 < z_info->equip_slots_max);
        }
      }
      mem_free(best);
      mem_free(test);
      _Var3 = borg_one_step_wearing_best(0);
      return _Var3;
    }
  }
  return false;
}

Assistant:

bool borg_best_stuff(void)
{
    int k;

    int32_t value;

    int i;

    uint8_t *test;
    uint8_t *best;

    /* only do this at home */
    if (shop_num != BORG_HOME)
        return false;

    /* if we don't need to do "best", check if we need to process the list */
    if (!borg.goal.do_best)
        return borg_one_step_wearing_best(0);

    /* must have a free inventory slot and a free home slot */
    if (borg_home_full() || borg_inventory_full())
        return false;

    /* only do this once per trip to town */
    if (!borg.goal.do_best)
        return false;

    best = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    test = mem_alloc(sizeof(uint8_t) * z_info->equip_slots_max);
    /* Hack -- Initialize */
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Initialize */
        best[k] = test[k] = 255;
    }

    /* Evaluate the inventory */
    value = borg.power;

    /* Determine the best possible equipment */
    (void)borg_best_stuff_aux(0, test, best, &value);

    /* Restore bonuses */
    borg_notice(true);

    /* convert the list into a list of items we can find even if they */
    /* change locations due to picking up and dropping items */
    /* Make first change. */
    borg_item *item;
    borg.goal.best_item
        = mem_zalloc(sizeof(struct borg_best) * z_info->equip_slots_max);
    bool found = false;
    for (k = 0; k < z_info->equip_slots_max; k++) {
        /* Get choice */
        i = best[k];

        /* Ignore non-changes */
        if (i == borg_best_stuff_order(k) || 255 == i)
            continue;

        found = true;
        if (i < 100) {
            item = &borg_items[i];
        } else {
            item = &borg_shops[BORG_HOME].ware[i - 100];
            borg.goal.best_item[k].home = true;
        }

        /* hopefully this is enough to get a unique item */
        borg.goal.best_item[k].tval = item->tval;
        borg.goal.best_item[k].pval = item->pval;
        borg.goal.best_item[k].sval = item->sval;
    }
    /* if we didn't change anything, clear out the changes */
    if (!found)
        borg_clear_best();

    /* we have done our best optimization.  */
    borg.goal.do_best = false;

    /* if we are being super chatty, spit out the new list of best */
    if (borg_cfg[BORG_VERBOSE]) {
        if (found) {
            for (i = 0; i < z_info->equip_slots_max; i++) {
                if (best[i] > 100) {
                    borg_note(format("new best: %s",
                        borg_shops[BORG_HOME].ware[best[i] - 100].desc));
                } else {
                    borg_note(format("new best: %s", borg_items[best[i]].desc));
                }
            }
        } else {
            borg_note("new best: no changes");
        }
    }
    mem_free(best);
    best = NULL;
    mem_free(test);
    test = NULL;

    return borg_one_step_wearing_best(0);
}